

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<unsigned_long_long,QSslServerPrivate::SocketData>::
emplace_helper<QMetaObject::Connection&,QMetaObject::Connection&,std::shared_ptr<QTimer>>
          (QHash<unsigned_long_long,_QSslServerPrivate::SocketData> *this,unsigned_long_long *key,
          Connection *args,Connection *args_1,shared_ptr<QTimer> *args_2)

{
  long lVar1;
  piter it;
  piter pVar2;
  Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *in_RCX;
  unsigned_long_long *in_RDX;
  Node<unsigned_long_long,_QSslServerPrivate::SocketData> *in_RSI;
  iterator<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *in_R8;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff78;
  Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>
  *in_stack_ffffffffffffff80;
  shared_ptr<QTimer> *in_stack_ffffffffffffff88;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>::
  findOrInsert<unsigned_long_long>(in_RCX,(unsigned_long_long *)in_R8);
  QHashPrivate::iterator<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>::
  node(in_R8);
  QHashPrivate::Node<unsigned_long_long,QSslServerPrivate::SocketData>::
  createInPlace<QMetaObject::Connection&,QMetaObject::Connection&,std::shared_ptr<QTimer>>
            (in_RSI,in_RDX,(Connection *)in_RCX,(Connection *)in_R8,in_stack_ffffffffffffff88);
  it.bucket = (size_t)in_stack_ffffffffffffff88;
  it.d = in_stack_ffffffffffffff80;
  QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::iterator::iterator
            (in_stack_ffffffffffffff78,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }